

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::SetStencilOp
          (GLContextState *this,GLenum Face,STENCIL_OP StencilFailOp,STENCIL_OP StencilDepthFailOp,
          STENCIL_OP StencilPassOp)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum GVar3;
  bool bVar4;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  bVar4 = Face != 0x404;
  if ((((this->m_DSState).m_StencilOpState[bVar4].StencilFailOp != StencilFailOp) ||
      ((this->m_DSState).m_StencilOpState[bVar4].StencilDepthFailOp != StencilDepthFailOp)) ||
     ((this->m_DSState).m_StencilOpState[bVar4].StencilPassOp != StencilPassOp)) {
    GVar1 = StencilOp2GlStencilOp(StencilFailOp);
    GVar2 = StencilOp2GlStencilOp(StencilDepthFailOp);
    GVar3 = StencilOp2GlStencilOp(StencilPassOp);
    (*__glewStencilOpSeparate)(Face,GVar1,GVar2,GVar3);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[32],char[17],unsigned_int>
                (false,"SetStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x239,(char (*) [32])"Failed to set stencil operation",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x239);
      std::__cxx11::string::~string((string *)&local_50);
    }
    (this->m_DSState).m_StencilOpState[bVar4].StencilFailOp = StencilFailOp;
    (this->m_DSState).m_StencilOpState[bVar4].StencilDepthFailOp = StencilDepthFailOp;
    (this->m_DSState).m_StencilOpState[bVar4].StencilPassOp = StencilPassOp;
  }
  return;
}

Assistant:

void GLContextState::SetStencilOp(GLenum Face, STENCIL_OP StencilFailOp, STENCIL_OP StencilDepthFailOp, STENCIL_OP StencilPassOp)
{
    DepthStencilGLState::StencilOpState& FaceStencilOp = m_DSState.m_StencilOpState[Face == GL_FRONT ? 0 : 1];
    if (FaceStencilOp.StencilFailOp != StencilFailOp ||
        FaceStencilOp.StencilDepthFailOp != StencilDepthFailOp ||
        FaceStencilOp.StencilPassOp != StencilPassOp)
    {
        GLenum glsfail = StencilOp2GlStencilOp(StencilFailOp);
        GLenum dpfail  = StencilOp2GlStencilOp(StencilDepthFailOp);
        GLenum dppass  = StencilOp2GlStencilOp(StencilPassOp);

        glStencilOpSeparate(Face, glsfail, dpfail, dppass);
        DEV_CHECK_GL_ERROR("Failed to set stencil operation");

        FaceStencilOp.StencilFailOp      = StencilFailOp;
        FaceStencilOp.StencilDepthFailOp = StencilDepthFailOp;
        FaceStencilOp.StencilPassOp      = StencilPassOp;
    }
}